

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O2

void __thiscall HMISong::SetupForHMI(HMISong *this,int len)

{
  short sVar1;
  int iVar2;
  int iVar3;
  BYTE *pBVar4;
  int iVar5;
  TrackInfo *pTVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  BYTE *__s1;
  uint uVar10;
  ulong uVar11;
  int local_64;
  
  this->ReadVarLen = ReadVarLenHMI;
  pBVar4 = this->MusHeader;
  sVar1 = *(short *)(pBVar4 + 0xe4);
  uVar10 = (uint)sVar1;
  this->NumTracks = uVar10;
  if (0 < sVar1) {
    (this->super_MIDIStreamer).Division = (int)*(short *)(pBVar4 + 0xd4) << 2;
    (this->super_MIDIStreamer).InitialTempo = 4000000;
    pTVar6 = (TrackInfo *)operator_new__((ulong)(uVar10 * 0x38 + 0x38));
    this->Tracks = pTVar6;
    iVar2 = *(int *)(pBVar4 + 0xe8);
    local_64 = 0;
    for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
      iVar3 = *(int *)(pBVar4 + uVar11 * 4 + (long)iVar2);
      if (iVar3 <= len + -0x9d) {
        __s1 = pBVar4 + iVar3;
        iVar5 = bcmp(__s1,"HMI-MIDITRACK",0xd);
        if (iVar5 == 0) {
          iVar5 = len;
          if (uVar11 != uVar10 - 1) {
            iVar5 = *(int *)(pBVar4 + uVar11 * 4 + (long)iVar2 + 4);
          }
          iVar8 = len - iVar3;
          if (iVar5 - iVar3 < len - iVar3) {
            iVar8 = iVar5 - iVar3;
          }
          if (0 < iVar8) {
            iVar3 = *(int *)(__s1 + 0x57);
            if (iVar8 - iVar3 != 0 && iVar3 <= iVar8) {
              lVar7 = (long)local_64;
              pTVar6[lVar7].TrackBegin = __s1 + iVar3;
              pTVar6[lVar7].TrackP = 0;
              pTVar6[lVar7].MaxTrackP = (ulong)(uint)(iVar8 - iVar3);
              for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
                pTVar6[lVar7].Designation[lVar9] = *(WORD *)(__s1 + lVar9 * 2 + 0x99);
              }
              local_64 = local_64 + 1;
            }
          }
        }
      }
    }
    this->NumTracks = local_64;
  }
  return;
}

Assistant:

void HMISong::SetupForHMI(int len)
{
	int i, p;

	ReadVarLen = ReadVarLenHMI;
	NumTracks = GetShort(MusHeader + HMI_TRACK_COUNT_OFFSET);

	if (NumTracks <= 0)
	{
		return;
	}

	// The division is the number of pulses per quarter note (PPQN).
	// HMI files have two values here, a full value and a quarter value. Some games, 
	// notably Quarantines, have identical values for some reason, so it's safer to
	// use the quarter value and multiply it by four than to trust the full value.
	Division = GetShort(MusHeader + HMI_DIVISION_OFFSET) << 2;
	InitialTempo = 4000000;

	Tracks = new TrackInfo[NumTracks + 1];
	int track_dir = GetInt(MusHeader + HMI_TRACK_DIR_PTR_OFFSET);

	// Gather information about each track
	for (i = 0, p = 0; i < NumTracks; ++i)
	{
		int start = GetInt(MusHeader + track_dir + i*4);
		int tracklen, datastart;

		if (start > len - HMITRACK_DESIGNATION_OFFSET - 4)
		{ // Track is incomplete.
			continue;
		}

		// BTW, HMI does not actually check the track header.
		if (memcmp(MusHeader + start, TRACK_MAGIC, 13) != 0)
		{
			continue;
		}

		// The track ends where the next one begins. If this is the
		// last track, then it ends at the end of the file.
		if (i == NumTracks - 1)
		{
			tracklen = len - start;
		}
		else
		{
			tracklen = GetInt(MusHeader + track_dir + i*4 + 4) - start;
		}
		// Clamp incomplete tracks to the end of the file.
		tracklen = MIN(tracklen, len - start);
		if (tracklen <= 0)
		{
			continue;
		}

		// Offset to actual MIDI events.
		datastart = GetInt(MusHeader + start + HMITRACK_DATA_PTR_OFFSET);
		tracklen -= datastart;
		if (tracklen <= 0)
		{
			continue;
		}

		// Store track information
		Tracks[p].TrackBegin = MusHeader + start + datastart;
		Tracks[p].TrackP = 0;
		Tracks[p].MaxTrackP = tracklen;

		// Retrieve track designations. We can't check them yet, since we have not yet
		// connected to the MIDI device.
		for (int ii = 0; ii < NUM_HMI_DESIGNATIONS; ++ii)
		{
			Tracks[p].Designation[ii] = GetShort(MusHeader + start + HMITRACK_DESIGNATION_OFFSET + ii*2);
		}

		p++;
	}

	// In case there were fewer actual chunks in the file than the
	// header specified, update NumTracks with the current value of p.
	NumTracks = p;
}